

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg * __thiscall
fmt::v5::internal::
context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
::do_get_arg(context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
             *this,uint arg_id)

{
  bool bVar1;
  basic_parse_context<wchar_t,_fmt::v5::internal::error_handler> *in_RSI;
  format_arg *in_RDI;
  size_type in_stack_0000000c;
  format_arg *arg;
  format_arg *message;
  
  message = in_RDI;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  ::get((basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
         *)arg,in_stack_0000000c);
  bVar1 = basic_format_arg::operator_cast_to_bool((basic_format_arg *)in_RDI);
  if (!bVar1) {
    basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>::on_error(in_RSI,(char *)message)
    ;
  }
  return message;
}

Assistant:

format_arg do_get_arg(unsigned arg_id) {
    format_arg arg = args_.get(arg_id);
    if (!arg)
      parse_context_.on_error("argument index out of range");
    return arg;
  }